

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

void __thiscall
unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
increment_inode_count<unodb::detail::olc_inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *this)

{
  reference pvVar1;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  
  pvVar1 = std::array<std::atomic<unsigned_long>,_5UL>::operator[]
                     ((array<std::atomic<unsigned_long>,_5UL> *)(this + 0x180),2);
  LOCK();
  (pvVar1->super___atomic_base<unsigned_long>)._M_i =
       (pvVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::increase_memory_use
            ((olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)this,0xc0
            );
  return;
}

Assistant:

constexpr void olc_db<Key, Value>::increment_inode_count() noexcept {
  static_assert(detail::olc_inode_defs<Key, Value>::template is_inode<INode>());

  node_counts[as_i<INode::type>].fetch_add(1, std::memory_order_relaxed);
  increase_memory_use(sizeof(INode));
}